

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

uint __thiscall MidiInApi::MidiQueue::size(MidiQueue *this,uint *__back,uint *__front)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = this->front;
  uVar2 = this->back;
  uVar3 = this->ringSize;
  if (__back != (uint *)0x0) {
    *__back = uVar2;
  }
  if (__front != (uint *)0x0) {
    *__front = uVar1;
  }
  uVar4 = 0;
  if (uVar2 < uVar1) {
    uVar4 = uVar3;
  }
  return (uVar2 - uVar1) + uVar4;
}

Assistant:

unsigned int MidiInApi::MidiQueue::size( unsigned int *__back,
                                         unsigned int *__front )
{
  // Access back/front members exactly once and make stack copies for
  // size calculation
  unsigned int _back = back, _front = front, _size;
  if ( _back >= _front )
    _size = _back - _front;
  else
    _size = ringSize - _front + _back;

  // Return copies of back/front so no new and unsynchronized accesses
  // to member variables are needed.
  if ( __back ) *__back = _back;
  if ( __front ) *__front = _front;
  return _size;
}